

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Tile TVar1;
  bool bVar2;
  SolveResult SVar3;
  ostream *poVar4;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a8;
  duration<long,_std::ratio<1L,_1000L>_> local_a0;
  rep local_98;
  rep elapsedMilliseconds;
  time_point end;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_80;
  time_point begin;
  byte local_70;
  SolveResult result;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  Board board;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    board._tiles.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)argv;
    Board::Board((Board *)local_38);
    TVar1 = board._tiles.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,(char *)TVar1,&local_59);
    bVar2 = Board::load((Board *)local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    if (bVar2) {
      Board::print((Board *)local_38);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      SolveResult::SolveResult((SolveResult *)((long)&begin.__d.__r + 4));
      bVar2 = Board::isSolveable((Board *)local_38);
      if (bVar2) {
        local_80.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        poVar4 = std::operator<<((ostream *)&std::cout,"solving...");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        SVar3 = Board::solve((Board *)local_38);
        end.__d.__r._0_4_ = SVar3.backtracks;
        local_70 = SVar3.solved;
        end.__d.__r._4_1_ = local_70;
        begin.__d.__r._4_4_ = (uint)end.__d.__r;
        elapsedMilliseconds = std::chrono::_V2::steady_clock::now();
        local_a8.__r = (rep)std::chrono::operator-
                                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)&elapsedMilliseconds,&local_80);
        local_a0.__r = (rep)std::chrono::
                            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                      (&local_a8);
        local_98 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_a0);
        if (((ulong)SVar3 & 0x100000000) != 0) {
          Board::print((Board *)local_38);
          std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<((ostream *)&std::cout,"solved in ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_98);
          poVar4 = std::operator<<(poVar4," ms");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<((ostream *)&std::cout,"with backtracks: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,begin.__d.__r._4_4_);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
      }
      if ((local_70 & 1) == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"is not solveable");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"could not load ");
      poVar4 = std::operator<<(poVar4,(char *)board._tiles.
                                              super__Vector_base<Tile,_std::allocator<Tile>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage[1]);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"press any key to exit...");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    getchar();
    Board::~Board((Board *)local_38);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	if (argc == 2)
	{
		Board board{};

		if (board.load(argv[1]))
		{
			board.print();

			std::cout << std::endl << std::endl;

			SolveResult result{};

			if (board.isSolveable())
			{
				auto begin = std::chrono::steady_clock::now();

				std::cout << "solving..." << std::endl << std::endl;
				result = board.solve();

				auto end = std::chrono::steady_clock::now();

				auto elapsedMilliseconds = std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count();

				if (result.solved)
				{
					board.print();
					std::cout << std::endl;
					std::cout << "solved in " << elapsedMilliseconds << " ms" << std::endl;
					std::cout << "with backtracks: " << result.backtracks << std::endl;
				}
			}

			if(!result.solved)
			{
				std::cout << "is not solveable" << std::endl;
			}
		}
		else
		{
			std::cout << "could not load " << argv[1] << std::endl;
		}

		std::cout << "press any key to exit..." << std::endl;
		std::getchar();
	}

	return 0;
}